

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,ArrayPtr<const_char> *params_2)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  FixedArray<char,_1UL> *rest;
  ArrayPtr<const_char> *rest_1;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  _ *local_40;
  undefined8 local_38;
  undefined1 local_29;
  ArrayPtr<const_char> *local_28;
  ArrayPtr<const_char> *params_local_2;
  FixedArray<char,_1UL> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_29 = 0;
  local_28 = (ArrayPtr<const_char> *)params_1;
  params_local_2 = params;
  params_local_1 = (FixedArray<char,_1UL> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_58 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_50 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_2);
  local_48 = ArrayPtr<const_char>::size(local_28);
  local_40 = (_ *)&local_58;
  local_38 = 3;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  size = sum(local_40,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  rest = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(local_28);
  fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (target,first,rest,rest_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}